

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

HighsHashTableEntry<int,_int> *
HighsHashTree<int,int>::findCommonInLeaf<4,2>(InnerLeaf<4> *leaf1,InnerLeaf<2> *leaf2,int hashPos)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  int *piVar9;
  reference this;
  Occupation *in_RSI;
  Occupation *in_RDI;
  int j;
  int i;
  int pos;
  int offset2;
  int offset1;
  uint64_t matchMask;
  undefined7 in_stack_ffffffffffffff98;
  uint8_t in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_3c;
  int local_38;
  int local_30;
  int local_2c;
  uint64_t local_28;
  
  uVar4 = HighsHashTree::Occupation::operator_cast_to_unsigned_long(in_RDI);
  uVar5 = HighsHashTree::Occupation::operator_cast_to_unsigned_long(in_RSI);
  local_28 = uVar4 & uVar5;
  if (local_28 != 0) {
    local_2c = -1;
    local_30 = -1;
LAB_005791d1:
    if (local_28 != 0) {
      uVar3 = HighsHashHelpers::log2i(local_28);
      local_28 = 1L << ((byte)uVar3 & 0x3f) ^ local_28;
      local_38 = HighsHashTree<int,_int>::Occupation::num_set_until
                           ((Occupation *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9f);
      local_38 = local_38 + local_2c;
      while( true ) {
        pvVar6 = std::array<unsigned_long,_55UL>::operator[]
                           ((array<unsigned_long,_55UL> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        bVar2 = HighsHashTree<int,_int>::get_first_chunk16((uint16_t)*pvVar6);
        if (bVar2 == uVar3) break;
        local_38 = local_38 + 1;
        local_2c = local_2c + 1;
      }
      local_3c = HighsHashTree<int,_int>::Occupation::num_set_until
                           ((Occupation *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff9f);
      local_3c = local_3c + local_30;
      while( true ) {
        pvVar7 = std::array<unsigned_long,_23UL>::operator[]
                           ((array<unsigned_long,_23UL> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        bVar2 = HighsHashTree<int,_int>::get_first_chunk16((uint16_t)*pvVar7);
        if (bVar2 == uVar3) break;
        local_3c = local_3c + 1;
        local_30 = local_30 + 1;
      }
      do {
        while( true ) {
          pvVar6 = std::array<unsigned_long,_55UL>::operator[]
                             ((array<unsigned_long,_55UL> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
          uVar1 = *pvVar6;
          pvVar7 = std::array<unsigned_long,_23UL>::operator[]
                             ((array<unsigned_long,_23UL> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
          if (*pvVar7 < uVar1) break;
          pvVar7 = std::array<unsigned_long,_23UL>::operator[]
                             ((array<unsigned_long,_23UL> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
          uVar1 = *pvVar7;
          pvVar6 = std::array<unsigned_long,_55UL>::operator[]
                             ((array<unsigned_long,_55UL> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
          if (*pvVar6 < uVar1) {
            if (local_3c + 1 == *(int *)(in_RSI + 8)) goto LAB_005791d1;
            pvVar7 = std::array<unsigned_long,_23UL>::operator[]
                               ((array<unsigned_long,_23UL> *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
            bVar2 = HighsHashTree<int,_int>::get_first_chunk16((uint16_t)*pvVar7);
          }
          else {
            pvVar8 = std::array<HighsHashTableEntry<int,_int>,_54UL>::operator[]
                               ((array<HighsHashTableEntry<int,_int>,_54UL> *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
            piVar9 = HighsHashTableEntry<int,_int>::key(pvVar8);
            in_stack_ffffffffffffffa4 = *piVar9;
            this = std::array<HighsHashTableEntry<int,_int>,_22UL>::operator[]
                             ((array<HighsHashTableEntry<int,_int>,_22UL> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
            piVar9 = HighsHashTableEntry<int,_int>::key(this);
            if (in_stack_ffffffffffffffa4 == *piVar9) {
              pvVar8 = std::array<HighsHashTableEntry<int,_int>,_54UL>::operator[]
                                 ((array<HighsHashTableEntry<int,_int>,_54UL> *)
                                  CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                  CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
              return pvVar8;
            }
            local_38 = local_38 + 1;
            if (local_38 == *(int *)(in_RDI + 8)) goto LAB_005791d1;
            pvVar6 = std::array<unsigned_long,_55UL>::operator[]
                               ((array<unsigned_long,_55UL> *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
            bVar2 = HighsHashTree<int,_int>::get_first_chunk16((uint16_t)*pvVar6);
            if ((bVar2 != uVar3) || (local_3c + 1 == *(int *)(in_RSI + 8))) goto LAB_005791d1;
            pvVar7 = std::array<unsigned_long,_23UL>::operator[]
                               ((array<unsigned_long,_23UL> *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
            bVar2 = HighsHashTree<int,_int>::get_first_chunk16((uint16_t)*pvVar7);
          }
          if (bVar2 != uVar3) goto LAB_005791d1;
          local_3c = local_3c + 1;
        }
        local_38 = local_38 + 1;
        if (local_38 == *(int *)(in_RDI + 8)) break;
        pvVar6 = std::array<unsigned_long,_55UL>::operator[]
                           ((array<unsigned_long,_55UL> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        bVar2 = HighsHashTree<int,_int>::get_first_chunk16((uint16_t)*pvVar6);
      } while (bVar2 == uVar3);
      goto LAB_005791d1;
    }
  }
  return (HighsHashTableEntry<int,_int> *)0x0;
}

Assistant:

static HighsHashTableEntry<K, V>* findCommonInLeaf(
      InnerLeaf<SizeClass1>* leaf1, InnerLeaf<SizeClass2>* leaf2, int hashPos) {
    uint64_t matchMask = leaf1->occupation & leaf2->occupation;
    if (matchMask == 0) return nullptr;

    int offset1 = -1;
    int offset2 = -1;
    while (matchMask) {
      int pos = HighsHashHelpers::log2i(matchMask);
      matchMask ^= (uint64_t{1} << pos);

      int i =
          leaf1->occupation.num_set_until(static_cast<uint8_t>(pos)) + offset1;
      while (get_first_chunk16(leaf1->hashes[i]) != pos) {
        ++i;
        ++offset1;
      }

      int j =
          leaf2->occupation.num_set_until(static_cast<uint8_t>(pos)) + offset2;
      while (get_first_chunk16(leaf2->hashes[j]) != pos) {
        ++j;
        ++offset2;
      }

      while (true) {
        if (leaf1->hashes[i] > leaf2->hashes[j]) {
          ++i;
          if (i == leaf1->size || get_first_chunk16(leaf1->hashes[i]) != pos)
            break;
        } else if (leaf2->hashes[j] > leaf1->hashes[i]) {
          ++j;
          if (j == leaf2->size || get_first_chunk16(leaf2->hashes[j]) != pos)
            break;
        } else {
          if (leaf1->entries[i].key() == leaf2->entries[j].key())
            return &leaf1->entries[i];

          ++i;
          if (i == leaf1->size || get_first_chunk16(leaf1->hashes[i]) != pos)
            break;
          ++j;
          if (j == leaf2->size || get_first_chunk16(leaf2->hashes[j]) != pos)
            break;
        }
      };
    }

    return nullptr;
  }